

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::Suffix_Array
          (Suffix_Array<unsigned_int> *this,char *T,idx_t n,idx_t subproblem_count,idx_t max_context
          )

{
  uint *puVar1;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  int local_4c;
  idx_t *local_40;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  undefined1 extraout_var [56];
  
  *in_RDI = in_RSI;
  *(uint *)(in_RDI + 1) = in_EDX;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  puVar1 = allocate<unsigned_int>(0);
  in_RDI[2] = puVar1;
  puVar1 = allocate<unsigned_int>(0);
  in_RDI[3] = puVar1;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  if (local_18 == 0) {
    local_40 = &default_subproblem_count;
  }
  else {
    local_40 = &local_18;
  }
  local_20 = local_14 >> 4;
  puVar1 = std::min<unsigned_int>(local_40,&local_20);
  *(uint *)(in_RDI + 6) = *puVar1;
  if (local_1c == 0) {
    local_4c = *(int *)(in_RDI + 1);
  }
  else {
    local_4c = local_1c;
  }
  *(int *)((long)in_RDI + 0x34) = local_4c;
  in_RDI[7] = 0;
  auVar2._0_8_ = std::log<unsigned_int>(0);
  auVar2._8_56_ = extraout_var;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar2._0_8_ * 32.0;
  auVar3 = vroundsd_avx(auVar2._0_16_,auVar3,10);
  local_24 = vcvttsd2usi_avx512f(auVar3);
  local_28 = *(uint *)(in_RDI + 1) / *(uint *)(in_RDI + 6) - 1;
  puVar1 = std::min<unsigned_int>(&local_24,&local_28);
  *(uint *)(in_RDI + 8) = *puVar1;
  puVar1 = allocate<unsigned_int>(0);
  in_RDI[9] = puVar1;
  puVar1 = allocate<unsigned_int>(0);
  in_RDI[10] = puVar1;
  if (*(uint *)(in_RDI + 1) < *(uint *)(in_RDI + 6)) {
    std::operator<<((ostream *)&std::cerr,"Incompatible subproblem-count. Aborting.\n");
    exit(1);
  }
  return;
}

Assistant:

Suffix_Array<T_idx_>::Suffix_Array(const char* const T, const idx_t n, const idx_t subproblem_count, const idx_t max_context):
    T_(T),
    n_(n),
    SA_(allocate<idx_t>(n_)),
    LCP_(allocate<idx_t>(n_)),
    SA_w(nullptr),
    LCP_w(nullptr),
    p_(std::min(subproblem_count > 0 ? subproblem_count : default_subproblem_count, n / 16)),   // TODO: fix subproblem-count for small `n`.
    max_context(max_context ? max_context : n_),
    pivot_(nullptr),
    pivot_per_part_(std::min(static_cast<idx_t>(std::ceil(32.0 * std::log(n_))), n_ / p_ - 1)), // (c \ln n) or (|subarray| - 1)
    part_size_scan_(allocate<idx_t>(p_ + 1)),
    part_ruler_(allocate<idx_t>(p_ * (p_ + 1)))
{
    assert(n_ >= 16);   // TODO: fix subproblem-count for small `n`.

    if(p_ > n_)
    {
        std::cerr << "Incompatible subproblem-count. Aborting.\n";
        std::exit(EXIT_FAILURE);
    }
}